

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::GPUShaderFP64Test2::prepareUniformVerification
          (GPUShaderFP64Test2 *this,shaderStage shader_stage,uniformTypeDetails *uniform_type,
          string *out_source_code)

{
  GLuint GVar1;
  GLuint GVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  string local_1d8 [32];
  stringstream stream;
  ostream local_1a8;
  
  GVar1 = uniform_type->m_n_rows;
  GVar2 = uniform_type->m_n_columns;
  getAmountUniforms(this,shader_stage,uniform_type);
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  poVar3 = std::operator<<(&local_1a8,"    int verification_result = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
  poVar3 = std::operator<<(poVar3,";\n\n    for (int i = 0; i < ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"; ++i)\n    {\n        if (");
  poVar3 = std::operator<<(poVar3,(string *)&uniform_type->m_type_name);
  std::operator<<(poVar3,"(");
  uVar4 = (ulong)(GVar1 * GVar2);
  for (uVar5 = 1; uVar5 - uVar4 != 1; uVar5 = uVar5 + 1) {
    poVar3 = std::operator<<(&local_1a8,"i * (");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,") + ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    if (uVar5 != uVar4) {
      std::operator<<(&local_1a8,", ");
    }
  }
  poVar3 = std::operator<<(&local_1a8,
                           ") != uniform_array[i])\n        {\n           verification_result = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
  std::operator<<(poVar3,";\n        }\n    }\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)out_source_code,local_1d8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return;
}

Assistant:

void GPUShaderFP64Test2::prepareUniformVerification(shaderStage shader_stage, const uniformTypeDetails& uniform_type,
													std::string& out_source_code) const
{
	glw::GLuint		  element_ordinal = 1;
	const glw::GLuint n_columns		  = uniform_type.m_n_columns;
	const glw::GLuint n_rows		  = uniform_type.m_n_rows;
	const glw::GLuint n_elements	  = n_columns * n_rows;
	const glw::GLuint n_uniforms	  = getAmountUniforms(shader_stage, uniform_type);
	std::stringstream stream;

	/*
	 * int verification_result = M_RESULT_SUCCESS;
	 *
	 * for (int i = 0; i < N_UNIFORMS; ++i)
	 * {
	 *     if (TYPE_NAME(i * (N_ELEMENTS) + 1) != uniform_array[i])
	 *     {
	 *         verification_result = M_RESULT_FAILURE
	 *     }
	 * }
	 */
	stream << "    int verification_result = " << m_result_success << ";\n"
																	  "\n"
																	  "    for (int i = 0; i < "
		   << n_uniforms << "; ++i)\n"
							"    {\n"
							"        if ("
		   << uniform_type.m_type_name << "(";

	for (glw::GLuint element = 0; element < n_elements; ++element, ++element_ordinal)
	{
		stream << "i * (" << n_elements << ") + " << element + 1;

		if (n_elements != element + 1)
		{
			stream << ", ";
		}
	}

	stream << ") != uniform_array[i])\n"
			  "        {\n"
			  "           verification_result = "
		   << m_result_failure << ";\n"
								  "        }\n"
								  "    }\n";

	out_source_code = stream.str();
}